

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Int64Math.cpp
# Opt level: O2

bool Int64Math::Mul(int64 left,int64 right,int64 *pResult)

{
  *pResult = left * right;
  return SEXT816(left * right) != SEXT816(left) * SEXT816(right);
}

Assistant:

bool
Int64Math::Mul(int64 left, int64 right, int64 *pResult)
{
#if __has_builtin(__builtin_mul_overflow) && !(defined(_ARM_) && defined(__clang__))
    return IntMathCommon<int64>::Mul(left, right, pResult);
#else

#if defined(_M_X64)
    int64 high;
    *pResult = _mul128(left, right, &high);
    return ((*pResult > 0) && high != 0) || ((*pResult < 0) && (high != -1));
#else
    *pResult = left * right;
    return (left != 0 && right != 0 && (*pResult / left) != right);
#endif

#endif  // !__has_builtin(__builtin_mul_overflow)
}